

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O0

bool CascGetStorageInfo(HANDLE hStorage,CASC_STORAGE_INFO_CLASS InfoClass,void *pvStorageInfo,
                       size_t cbStorageInfo,size_t *pcbLengthNeeded)

{
  DWORD DVar1;
  TCascStorage *pTVar2;
  uint local_44;
  DWORD dwInfoValue;
  TCascStorage *hs;
  size_t *pcbLengthNeeded_local;
  size_t cbStorageInfo_local;
  void *pvStorageInfo_local;
  CASC_STORAGE_INFO_CLASS InfoClass_local;
  HANDLE hStorage_local;
  
  pTVar2 = IsValidCascStorageHandle(hStorage);
  if (pTVar2 == (TCascStorage *)0x0) {
    SetLastError(9);
    hStorage_local._7_1_ = false;
  }
  else {
    switch(InfoClass) {
    case CascStorageFileCount:
      local_44 = (uint)pTVar2->pEKeyEntryMap->ItemCount;
      break;
    case CascStorageFeatures:
      DVar1 = TRootHandler::GetFlags(pTVar2->pRootHandler);
      local_44 = (uint)((DVar1 & 1) != 0);
      break;
    case CascStorageGameInfo:
      local_44 = pTVar2->dwGameInfo;
      break;
    case CascStorageGameBuild:
      local_44 = pTVar2->dwBuildNumber;
      break;
    case CascStorageInstalledLocales:
      local_44 = pTVar2->dwDefaultLocale;
      break;
    default:
      SetLastError(0x16);
      return false;
    }
    if (cbStorageInfo < 4) {
      *pcbLengthNeeded = 4;
      SetLastError(0x69);
      hStorage_local._7_1_ = false;
    }
    else {
      *(uint *)pvStorageInfo = local_44;
      hStorage_local._7_1_ = true;
    }
  }
  return hStorage_local._7_1_;
}

Assistant:

bool WINAPI CascGetStorageInfo(
    HANDLE hStorage,
    CASC_STORAGE_INFO_CLASS InfoClass,
    void * pvStorageInfo,
    size_t cbStorageInfo,
    size_t * pcbLengthNeeded)
{
    TCascStorage * hs;
    DWORD dwInfoValue = 0;

    // Verify the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Differentiate between info classes
    switch(InfoClass)
    {
        case CascStorageFileCount:
            dwInfoValue = (DWORD)hs->pEKeyEntryMap->ItemCount;
            break;

        case CascStorageFeatures:
            dwInfoValue |= (hs->pRootHandler->GetFlags() & ROOT_FLAG_HAS_NAMES) ? CASC_FEATURE_HAS_NAMES : 0;
            break;

        case CascStorageGameInfo:
            dwInfoValue = hs->dwGameInfo;
            break;

        case CascStorageGameBuild:
            dwInfoValue = hs->dwBuildNumber;
            break;

        case CascStorageInstalledLocales:
            dwInfoValue = hs->dwDefaultLocale;
            break;

        default:
            SetLastError(ERROR_INVALID_PARAMETER);
            return false;
    }

    //
    // Return the required DWORD value
    //

    if(cbStorageInfo < sizeof(DWORD))
    {
        *pcbLengthNeeded = sizeof(DWORD);
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return false;
    }

    // Give the number of files
    *(PDWORD)pvStorageInfo = dwInfoValue;
    return true;
}